

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O0

bool tchecker::syncprod::operator==(state_t *s1,state_t *s2)

{
  bool bVar1;
  make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *a1;
  make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *a2;
  undefined1 local_19;
  state_t *s2_local;
  state_t *s1_local;
  
  bVar1 = tchecker::ts::operator==((state_t *)s1,(state_t *)s2);
  local_19 = false;
  if (bVar1) {
    a1 = &state_t::vloc(s1)->super_loc_array_t;
    a2 = &state_t::vloc(s2)->super_loc_array_t;
    local_19 = tchecker::operator==(a1,a2);
  }
  return local_19;
}

Assistant:

bool operator==(tchecker::syncprod::state_t const & s1, tchecker::syncprod::state_t const & s2)
{
  return (static_cast<tchecker::ts::state_t const &>(s1) == static_cast<tchecker::ts::state_t const &>(s2) &&
          s1.vloc() == s2.vloc());
}